

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtc.cc
# Opt level: O0

void anon_unknown.dwarf_16ca0::usage(string *argv0)

{
  FILE *__stream;
  undefined8 uVar1;
  dtc local_30 [32];
  string *local_10;
  string *argv0_local;
  
  __stream = _stderr;
  local_10 = argv0;
  dtc::__xpg_basename(local_30,(char *)argv0);
  uVar1 = std::__cxx11::string::c_str();
  fprintf(__stream,
          "Usage:\n\t%s\t[-fhsv@] [-b boot_cpu_id] [-d dependency_file][-E [no-]checker_name]\n\t\t[-H phandle_format] [-I input_format][-O output_format]\n\t\t[-o output_file] [-R entries] [-S bytes] [-p bytes][-V blob_version]\n\t\t-W [no-]checker_name] input_file\n"
          ,uVar1);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void usage(const string &argv0)
{
	fprintf(stderr, "Usage:\n"
		"\t%s\t[-fhsv@] [-b boot_cpu_id] [-d dependency_file]"
			"[-E [no-]checker_name]\n"
		"\t\t[-H phandle_format] [-I input_format]"
			"[-O output_format]\n"
		"\t\t[-o output_file] [-R entries] [-S bytes] [-p bytes]"
			"[-V blob_version]\n"
		"\t\t-W [no-]checker_name] input_file\n", basename(argv0).c_str());
}